

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O0

GLuint gl4cts::KHRDebug::LabelsTest::createQuery(Functions *gl,RenderContext *rc)

{
  bool bVar1;
  ContextType ctxType;
  ApiType requiredApiType;
  deUint32 dVar2;
  GLuint local_1c;
  RenderContext *pRStack_18;
  GLuint id;
  RenderContext *rc_local;
  Functions *gl_local;
  
  local_1c = 0;
  pRStack_18 = rc;
  rc_local = (RenderContext *)gl;
  ctxType.super_ApiType.m_bits = (ApiType)(*rc->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  if (bVar1) {
    (*(code *)rc_local[0x7b]._vptr_RenderContext)(0x8e28,1,&local_1c);
    dVar2 = (*(code *)rc_local[0x100]._vptr_RenderContext)();
    glu::checkError(dVar2,"CreateQueries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x3ce);
  }
  else {
    (*(code *)rc_local[0xdc]._vptr_RenderContext)(1,&local_1c);
    (*(code *)rc_local[4]._vptr_RenderContext)(0x8914,local_1c);
    (*(code *)rc_local[0xc5]._vptr_RenderContext)(0x8914);
    dVar2 = (*(code *)rc_local[0x100]._vptr_RenderContext)();
    glu::checkError(dVar2,"GenQueries / BeginQuery / EndQuery",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x3d5);
  }
  return local_1c;
}

Assistant:

GLuint LabelsTest::createQuery(const Functions* gl, const glu::RenderContext* rc)
{
	GLuint id = 0;
	if (glu::contextSupports(rc->getType(), glu::ApiType::core(4, 5)))
	{
		gl->createQueries(GL_TIMESTAMP, 1, &id);
		GLU_EXPECT_NO_ERROR(gl->getError(), "CreateQueries");
	}
	else
	{
		gl->genQueries(1, &id);
		gl->beginQuery(GL_SAMPLES_PASSED, id);
		gl->endQuery(GL_SAMPLES_PASSED);
		GLU_EXPECT_NO_ERROR(gl->getError(), "GenQueries / BeginQuery / EndQuery");
	}

	return id;
}